

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool __thiscall
llvm::cl::Option::error(Option *this,Twine *Message,StringRef ArgName,raw_ostream *Errs)

{
  StringRef Str;
  CommandLineParser *Str_00;
  raw_ostream *prVar1;
  raw_ostream *Errs_local;
  Twine *Message_local;
  Option *this_local;
  StringRef ArgName_local;
  
  ArgName_local.Data = (char *)ArgName.Length;
  this_local = (Option *)ArgName.Data;
  if (this_local == (Option *)0x0) {
    this_local = (Option *)(this->ArgStr).Data;
    ArgName_local.Data = (char *)(this->ArgStr).Length;
  }
  ArgName_local.Length = (size_t)&this_local;
  if (ArgName_local.Data == (char *)0x0) {
    raw_ostream::operator<<(Errs,this->HelpStr);
  }
  else {
    Str_00 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             ::operator->(&GlobalParser);
    prVar1 = raw_ostream::operator<<(Errs,&Str_00->ProgramName);
    prVar1 = raw_ostream::operator<<(prVar1,": for the -");
    Str.Length = (size_t)ArgName_local.Data;
    Str.Data = (char *)this_local;
    raw_ostream::operator<<(prVar1,Str);
  }
  prVar1 = raw_ostream::operator<<(Errs," option: ");
  prVar1 = llvm::operator<<(prVar1,Message);
  raw_ostream::operator<<(prVar1,"\n");
  return true;
}

Assistant:

bool Option::error(const Twine &Message, StringRef ArgName, raw_ostream &Errs) {
  if (!ArgName.data())
    ArgName = ArgStr;
  if (ArgName.empty())
    Errs << HelpStr; // Be nice for positional arguments
  else
    Errs << GlobalParser->ProgramName << ": for the -" << ArgName;

  Errs << " option: " << Message << "\n";
  return true;
}